

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyTypeUrl
          (ParserImpl *this,string *full_type_name,string *prefix)

{
  bool bVar1;
  allocator local_c9;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  uint local_84;
  undefined1 local_80 [8];
  string url;
  allocator local_49;
  string local_48;
  string *local_28;
  string *prefix_local;
  string *full_type_name_local;
  ParserImpl *this_local;
  
  local_28 = prefix;
  prefix_local = full_type_name;
  full_type_name_local = (string *)this;
  bVar1 = ConsumeIdentifier(this,prefix);
  if (bVar1) {
    do {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_48,".",&local_49);
      bVar1 = TryConsume(this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c8,"/",&local_c9);
        bVar1 = Consume(this,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
        if (bVar1) {
          std::__cxx11::string::operator+=((string *)local_28,"/");
          bVar1 = ConsumeFullTypeName(this,prefix_local);
          if (bVar1) {
            this_local._7_1_ = 1;
          }
          else {
            this_local._7_1_ = 0;
          }
        }
        else {
          this_local._7_1_ = 0;
        }
        break;
      }
      std::__cxx11::string::string((string *)local_80);
      bVar1 = ConsumeIdentifier(this,(string *)local_80);
      if (bVar1) {
        std::operator+(&local_a8,".",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
      }
      else {
        this_local._7_1_ = 0;
      }
      local_84 = (uint)!bVar1;
      std::__cxx11::string::~string((string *)local_80);
    } while (local_84 == 0);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ConsumeAnyTypeUrl(std::string* full_type_name, std::string* prefix) {
    // TODO(saito) Extend Consume() to consume multiple tokens at once, so that
    // this code can be written as just DO(Consume(kGoogleApisTypePrefix)).
    DO(ConsumeIdentifier(prefix));
    while (TryConsume(".")) {
      std::string url;
      DO(ConsumeIdentifier(&url));
      *prefix += "." + url;
    }
    DO(Consume("/"));
    *prefix += "/";
    DO(ConsumeFullTypeName(full_type_name));

    return true;
  }